

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O2

char * __thiscall DynamicProfileStorage::StorageInfo::ReadRecord(StorageInfo *this)

{
  bool bVar1;
  DWORD bufferSize;
  char *buffer;
  char *t;
  char16 local_248 [4];
  char16 cacheFilename [260];
  undefined1 auStack_38 [8];
  DynamicProfileStorageReaderWriter reader;
  
  GetFilename(this,local_248);
  auStack_38 = (undefined1  [8])0x0;
  reader.filename = (char16 *)0x0;
  bVar1 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)auStack_38,local_248,L"rb",false,
                     (errno_t *)0x0);
  if (bVar1) {
    bufferSize = DynamicProfileStorageReaderWriter::Size
                           ((DynamicProfileStorageReaderWriter *)auStack_38);
    buffer = AllocRecord(bufferSize);
    if (buffer == (char *)0x0) {
      Output::Print(L"ERROR: DynamicProfileStorage: Out of memory reading \'%s\'",local_248);
      Output::Flush();
    }
    else {
      t = GetRecordBuffer(buffer);
      bVar1 = DynamicProfileStorageReaderWriter::ReadArray<char>
                        ((DynamicProfileStorageReaderWriter *)auStack_38,t,(long)(int)bufferSize);
      if (bVar1) goto LAB_0088fade;
      DeleteRecord(buffer);
    }
  }
  else {
    bVar1 = DoTrace();
    if (bVar1) {
      Output::Print(L"TRACE: DynamicProfileStorage: Unable to open cache dir file \'%s\'",local_248)
      ;
      Output::Flush();
    }
  }
  buffer = (char *)0x0;
LAB_0088fade:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)auStack_38);
  return buffer;
}

Assistant:

char const * DynamicProfileStorage::StorageInfo::ReadRecord() const
{
    char16 cacheFilename[_MAX_PATH];
    this->GetFilename(cacheFilename);
    DynamicProfileStorageReaderWriter reader;
    if (!reader.Init(cacheFilename, _u("rb"), false))
    {
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Unable to open cache dir file '%s'"), cacheFilename);
            Output::Flush();
        }
#endif
        return nullptr;
    }

    int32 size = reader.Size();
    char * record = AllocRecord(size);
    if (record == nullptr)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory reading '%s'"), cacheFilename);
        Output::Flush();
        return nullptr;
    }

    if (!reader.ReadArray(GetRecordBuffer(record), size))
    {
        DeleteRecord(record);
        return nullptr;
    }
    return record;
}